

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop.cc
# Opt level: O0

void __thiscall verona::track::gen(track *this,Location *loc)

{
  bool bVar1;
  reference __k;
  mapped_type *this_00;
  mapped_type_conflict *pmVar2;
  Location *loc_local;
  track *this_local;
  
  if ((this->llvm & 1U) == 0) {
    bVar1 = ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::empty((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     *)&this->stack);
    if (bVar1) {
      pmVar2 = ::std::
               map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
               ::operator[](&this->params,loc);
      *pmVar2 = true;
    }
    else {
      __k = ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    *)&this->stack);
      this_00 = ::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,__k);
      pmVar2 = ::std::
               map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
               ::operator[](this_00,loc);
      *pmVar2 = true;
    }
  }
  return;
}

Assistant:

void gen(const Location& loc)
    {
      if (!llvm)
      {
        if (stack.empty())
          params[loc] = true;
        else
          lets[stack.back()][loc] = true;
      }
    }